

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffbnfmll(char *tform,int *dtcode,LONGLONG *trepeat,long *twidth,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  byte *pbVar8;
  char *errmsg;
  byte *pbVar9;
  byte bVar10;
  size_t sVar11;
  double drepeat;
  long width;
  char temp [71];
  double local_e0;
  long local_d8 [12];
  byte local_78 [72];
  
  if (0 < *status) {
    return *status;
  }
  if (dtcode != (int *)0x0) {
    *dtcode = 0;
  }
  if (trepeat != (LONGLONG *)0x0) {
    *trepeat = 0;
  }
  if (twidth != (long *)0x0) {
    *twidth = 0;
  }
  sVar2 = strlen(tform);
  sVar11 = 0;
  if (sVar2 != 0) {
    do {
      if (tform[sVar11] != ' ') goto LAB_00139e39;
      sVar11 = sVar11 + 1;
    } while (sVar2 != sVar11);
LAB_00139e3e:
    errmsg = "Error: binary table TFORM code is blank (ffbnfmll).";
LAB_00139e5f:
    ffxmsg(5,errmsg);
    *status = 0x105;
    return 0x105;
  }
LAB_00139e39:
  if (sVar11 == sVar2) goto LAB_00139e3e;
  sVar2 = strlen(tform + sVar11);
  if (0x46 < sVar2) {
    errmsg = "Error: binary table TFORM code is too long (ffbnfmll).";
    goto LAB_00139e5f;
  }
  strcpy((char *)local_78,tform + sVar11);
  ffupch((char *)local_78);
  ppuVar3 = __ctype_b_loc();
  lVar4 = 1;
  pbVar8 = local_78;
  do {
    pbVar6 = pbVar8;
    bVar10 = *pbVar6;
    pbVar8 = pbVar6 + 1;
    lVar4 = lVar4 + -1;
  } while ((*(byte *)((long)*ppuVar3 + (long)(char)bVar10 * 2 + 1) & 8) != 0);
  if (lVar4 == 0) {
    lVar4 = 1;
  }
  else {
    __isoc99_sscanf(local_78,"%lf",&local_e0);
    lVar4 = (long)(local_e0 + 0.1);
    bVar10 = *pbVar6;
  }
  bVar10 = bVar10 & 0xfe;
  pbVar9 = pbVar6;
  if (bVar10 == 0x50) {
    pbVar9 = pbVar8;
  }
  lVar5 = 2;
  switch(*pbVar9) {
  case 0x41:
    pbVar6 = pbVar6 + 2;
    if (bVar10 != 0x50) {
      pbVar6 = pbVar8;
    }
    if (*pbVar6 != 0) {
      if (*pbVar6 == 0x28) {
        pbVar9 = pbVar6;
      }
      iVar1 = __isoc99_sscanf(pbVar9 + 1,"%ld",local_d8);
      if ((iVar1 == 1) &&
         ((iVar1 = 0x10, lVar5 = local_d8[0], bVar10 == 0x50 || (local_d8[0] <= lVar4)))) break;
    }
    iVar1 = 0x10;
    lVar5 = lVar4;
    break;
  case 0x42:
    iVar1 = 0xb;
    goto LAB_0013a05d;
  case 0x43:
    iVar1 = 0x53;
    goto LAB_0013a039;
  case 0x44:
    iVar1 = 0x52;
    goto LAB_0013a039;
  case 0x45:
    iVar1 = 0x2a;
    goto LAB_0013a045;
  default:
    snprintf((char *)local_d8,0x51,"Illegal binary table TFORMn datatype: \'%s\' ",tform);
    ffxmsg(5,(char *)local_d8);
    *status = 0x106;
    return 0x106;
  case 0x49:
    iVar1 = 0x15;
    break;
  case 0x4a:
    iVar1 = 0x29;
    goto LAB_0013a045;
  case 0x4b:
    iVar1 = 0x51;
    goto LAB_0013a039;
  case 0x4c:
    iVar1 = 0xe;
    goto LAB_0013a05d;
  case 0x4d:
    iVar1 = 0xa3;
    lVar5 = 0x10;
    break;
  case 0x53:
    iVar1 = 0xc;
    goto LAB_0013a05d;
  case 0x55:
    iVar1 = 0x14;
    break;
  case 0x56:
    iVar1 = 0x28;
LAB_0013a045:
    lVar5 = 4;
    break;
  case 0x57:
    iVar1 = 0x50;
LAB_0013a039:
    lVar5 = 8;
    break;
  case 0x58:
    iVar1 = 1;
LAB_0013a05d:
    lVar5 = 1;
  }
  if (dtcode != (int *)0x0) {
    iVar7 = -iVar1;
    if (bVar10 != 0x50) {
      iVar7 = iVar1;
    }
    *dtcode = iVar7;
  }
  if (trepeat != (LONGLONG *)0x0) {
    *trepeat = lVar4;
  }
  if (twidth != (long *)0x0) {
    *twidth = lVar5;
  }
  return *status;
}

Assistant:

int ffbnfmll(char *tform,     /* I - format code from the TFORMn keyword */
           int *dtcode,   /* O - numerical datatype code */
           LONGLONG *trepeat,    /* O - repeat count of the field  */
           long *twidth,     /* O - width of the field, in chars */
           int *status)     /* IO - error status      */
{
/*
  parse the binary table TFORM column format to determine the data
  type, repeat count, and the field width (if it is an ASCII (A) field)
*/
    size_t ii, nchar;
    int datacode, variable, iread;
    long width;
    LONGLONG repeat;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];
    double drepeat;

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (trepeat)
        *trepeat = 0;

    if (twidth)
        *twidth = 0;

    nchar = strlen(tform);

    for (ii = 0; ii < nchar; ii++)
    {
        if (tform[ii] != ' ')     /* find first non-space char */
            break;
    }

    if (ii == nchar)
    {
        ffpmsg("Error: binary table TFORM code is blank (ffbnfmll).");
        return(*status = BAD_TFORM);
    }
    
    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: binary table TFORM code is too long (ffbnfmll).");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */

    /*-----------------------------------------------*/
    /*       get the repeat count                    */
    /*-----------------------------------------------*/

    ii = 0;
    while(isdigit((int) form[ii]))
        ii++;   /* look for leading digits in the field */

    if (ii == 0)
        repeat = 1;  /* no explicit repeat count */
    else {
       /* read repeat count */

        /* print as double, because the string-to-64-bit int conversion */
        /* character is platform dependent (%lld, %ld, %I64d)           */

        sscanf(form,"%lf", &drepeat);
        repeat = (LONGLONG) (drepeat + 0.1);
    }
    /*-----------------------------------------------*/
    /*             determine datatype code           */
    /*-----------------------------------------------*/

    form = form + ii;  /* skip over the repeat field */

    if (form[0] == 'P' || form[0] == 'Q')
    {
        variable = 1;  /* this is a variable length column */
/*        repeat = 1;  */  /* disregard any other repeat value */
        form++;        /* move to the next data type code char */
    }
    else
        variable = 0;

    if (form[0] == 'U')  /* internal code to signify unsigned integer */
    { 
        datacode = TUSHORT;
        width = 2;
    }
    else if (form[0] == 'I')
    {
        datacode = TSHORT;
        width = 2;
    }
    else if (form[0] == 'V') /* internal code to signify unsigned integer */
    {
        datacode = TULONG;
        width = 4;
    }
    else if (form[0] == 'W') /* internal code to signify unsigned long long integer */
    {
        datacode = TULONGLONG;
        width = 8;
    }
    else if (form[0] == 'J')
    {
        datacode = TLONG;
        width = 4;
    }
    else if (form[0] == 'K')
    {
        datacode = TLONGLONG;
        width = 8;
    }
    else if (form[0] == 'E')
    {
        datacode = TFLOAT;
        width = 4;
    }
    else if (form[0] == 'D')
    {
        datacode = TDOUBLE;
        width = 8;
    }
    else if (form[0] == 'A')
    {
        datacode = TSTRING;

        /*
          the following code is used to support the non-standard
          datatype of the form rAw where r = total width of the field
          and w = width of fixed-length substrings within the field.
        */
        iread = 0;
        if (form[1] != 0)
        {
            if (form[1] == '(' )  /* skip parenthesis around */
                form++;          /* variable length column width */

            iread = sscanf(&form[1],"%ld", &width);
        }

        if (iread != 1 || (!variable && (width > repeat)) )
            width = (long) repeat;
  
    }
    else if (form[0] == 'L')
    {
        datacode = TLOGICAL;
        width = 1;
    }
    else if (form[0] == 'X')
    {
        datacode = TBIT;
        width = 1;
    }
    else if (form[0] == 'B')
    {
        datacode = TBYTE;
        width = 1;
    }
    else if (form[0] == 'S') /* internal code to signify signed byte */
    {
        datacode = TSBYTE;
        width = 1;
    }
    else if (form[0] == 'C')
    {
        datacode = TCOMPLEX;
        width = 8;
    }
    else if (form[0] == 'M')
    {
        datacode = TDBLCOMPLEX;
        width = 16;
    }
    else
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal binary table TFORMn datatype: \'%s\' ", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (variable)
        datacode = datacode * (-1); /* flag variable cols w/ neg type code */

    if (dtcode)
       *dtcode = datacode;

    if (trepeat)
       *trepeat = repeat;

    if (twidth)
       *twidth = width;

    return(*status);
}